

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::EnumName_abi_cxx11_(EnumDescriptor *descriptor)

{
  EnumDescriptor *in_RSI;
  string *in_RDI;
  string *in_stack_00000010;
  string *in_stack_00000018;
  string *in_stack_00000020;
  string *in_stack_00000028;
  string name;
  string prefix;
  string *file;
  allocator local_81;
  string local_80 [48];
  string local_50 [32];
  string local_30 [8];
  EnumDescriptor *in_stack_ffffffffffffffd8;
  
  file = in_RDI;
  EnumDescriptor::file(in_RSI);
  FileClassPrefix_abi_cxx11_((FileDescriptor *)file);
  ClassNameWorker_abi_cxx11_(in_stack_ffffffffffffffd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"_Enum",&local_81);
  anon_unknown_0::SanitizeNameForObjC
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string EnumName(const EnumDescriptor* descriptor) {
  // 1. Enum names are used as is (style calls for CamelCase, trust it).
  // 2. Check for reserved word at the every end and then suffix things.
  //      message Fixed {
  //        message Size {...}
  //        enum Mumble {...}
  //      ...
  //      }
  //    yields Fixed_Class, Fixed_Size.
  const string prefix = FileClassPrefix(descriptor->file());
  const string name = ClassNameWorker(descriptor);
  return SanitizeNameForObjC(prefix, name, "_Enum", NULL);
}